

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeConfig.cpp
# Opt level: O3

int __thiscall cali::RuntimeConfig::init(RuntimeConfig *this,EVP_PKEY_CTX *ctx)

{
  ConfigSet *pCVar1;
  long *in_RCX;
  config_entry_list_t *in_RDX;
  char *__s;
  long *plVar2;
  config_entry_list_t converted_list;
  allocator<char> local_ea;
  allocator<char> local_e9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  _Base_ptr local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Alloc_hider local_88;
  _Base_ptr local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  ConfigSet *local_48;
  EVP_PKEY_CTX *local_40;
  config_entry_list_t *local_38;
  
  local_68.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = (ConfigSet *)this;
  local_40 = ctx;
  local_38 = in_RDX;
  if ((in_RCX != (long *)0x0) && (__s = (char *)*in_RCX, __s != (char *)0x0)) {
    plVar2 = in_RCX + 5;
    do {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,__s,&local_e9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,(char *)plVar2[-3],&local_ea);
      if (local_c8 == &local_b8) {
        local_98._8_8_ = local_b8._8_8_;
        local_a8._0_8_ = &local_98;
      }
      else {
        local_a8._0_8_ = local_c8;
      }
      local_98._M_allocated_capacity._1_7_ = local_b8._M_allocated_capacity._1_7_;
      local_98._M_local_buf[0] = local_b8._M_local_buf[0];
      local_a8._8_8_ = local_c0;
      local_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_b8._M_local_buf[0] = '\0';
      if (local_e8 == &local_d8) {
        local_78._8_8_ = local_d8._8_8_;
        local_88._M_p = (pointer)&local_78;
      }
      else {
        local_88._M_p = (pointer)local_e8;
      }
      local_78._M_allocated_capacity._1_7_ = local_d8._M_allocated_capacity._1_7_;
      local_78._M_local_buf[0] = local_d8._M_local_buf[0];
      local_80 = local_e0;
      local_e0 = (_Base_ptr)0x0;
      local_d8._M_local_buf[0] = '\0';
      local_e8 = &local_d8;
      local_c8 = &local_b8;
      std::
      vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  *)&local_68,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_p != &local_78) {
        operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._0_8_ != &local_98) {
        operator_delete((void *)local_a8._0_8_,local_98._M_allocated_capacity + 1);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,CONCAT71(local_d8._M_allocated_capacity._1_7_,
                                          local_d8._M_local_buf[0]) + 1);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,CONCAT71(local_b8._M_allocated_capacity._1_7_,
                                          local_b8._M_local_buf[0]) + 1);
      }
      __s = (char *)*plVar2;
      plVar2 = plVar2 + 5;
    } while (__s != (char *)0x0);
  }
  RuntimeConfigImpl::init_configset((RuntimeConfigImpl *)local_a8,*(char **)local_40,local_38);
  pCVar1 = local_48;
  ConfigSet::ConfigSet(local_48,(shared_ptr<cali::ConfigSetImpl> *)local_a8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_68);
  return (int)pCVar1;
}

Assistant:

ConfigSet RuntimeConfig::init(const char* name, const ConfigSet::Entry* list)
{
    config_entry_list_t converted_list;

    for (const ConfigSet::Entry* e = list; e && e->key; ++e)
        converted_list.emplace_back(std::make_pair<std::string, std::string>(e->key, e->value));

    return ConfigSet(mP->init_configset(name, converted_list));
}